

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O0

void Cmd_eval(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  FProduction *block;
  char *pcVar3;
  FBaseCVar *this;
  UCVarValue local_38;
  UCVarValue val;
  FBaseCVar *var;
  FProduction *prod;
  int parsept;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  prod._4_4_ = key;
  _parsept = who;
  who_local = (APlayerPawn *)argv;
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    prod._0_4_ = 1;
    block = ParseExpression((FCommandLine *)who_local,(int *)&prod);
    iVar1 = (int)prod;
    if (block != (FProduction *)0x0) {
      iVar2 = FCommandLine::argc((FCommandLine *)who_local);
      if (iVar1 < iVar2) {
        pcVar3 = FCommandLine::operator[]((FCommandLine *)who_local,(int)prod);
        this = FindCVar(pcVar3,(FBaseCVar **)0x0);
        if (this == (FBaseCVar *)0x0) {
          pcVar3 = FCommandLine::operator[]((FCommandLine *)who_local,(int)prod);
          Printf("Unknown variable %s\n",pcVar3);
        }
        else if (block->Type == PROD_Double) {
          local_38.Float = (float)*(double *)(block + 2);
          FBaseCVar::SetGenericRep(this,local_38,CVAR_Float);
        }
        else {
          FBaseCVar::SetGenericRep(this,(UCVarValue)(block + 1),CVAR_String);
        }
      }
      else if (block->Type == PROD_Double) {
        Printf("%g\n",*(undefined8 *)(block + 2));
      }
      else {
        Printf("%s\n",block + 1);
      }
      M_Free(block);
      return;
    }
  }
  Printf("Usage: eval <expression> [variable]\n");
  return;
}

Assistant:

CCMD (eval)
{
	if (argv.argc() >= 2)
	{
		int parsept = 1;
		FProduction *prod = ParseExpression (argv, parsept);

		if (prod != NULL)
		{
			if (parsept < argv.argc())
			{
				FBaseCVar *var = FindCVar (argv[parsept], NULL);
				if (var == NULL)
				{
					Printf ("Unknown variable %s\n", argv[parsept]);
				}
				else
				{
					UCVarValue val;

					if (prod->Type == PROD_Double)
					{
						val.Float = (float)static_cast<FDoubleProd *>(prod)->Value;
						var->SetGenericRep (val, CVAR_Float);
					}
					else
					{
						val.String = static_cast<FStringProd *>(prod)->Value;
						var->SetGenericRep (val, CVAR_String);
					}
				}
			}
			else
			{
				if (prod->Type == PROD_Double)
				{
					Printf ("%g\n", static_cast<FDoubleProd *>(prod)->Value);
				}
				else
				{
					Printf ("%s\n", static_cast<FStringProd *>(prod)->Value);
				}
			}
			M_Free (prod);
			return;
		}
	}

	Printf ("Usage: eval <expression> [variable]\n");
}